

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
NoiseCoeffsSignalsDifferentNoiseType<BitDepthParams<unsigned_char,_8,_false>_>::TestBody
          (NoiseCoeffsSignalsDifferentNoiseType<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  bool bVar1;
  int iVar2;
  char *lhs_expression;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  int i_1;
  AssertionResult gtest_ar;
  int i;
  double kCoeffs [2] [24];
  int height;
  int width;
  aom_noise_model_t *model;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdd4;
  anon_enum_32 *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  Type in_stack_fffffffffffffdfc;
  AssertHelper *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  NoiseModelUpdateTest<BitDepthParams<unsigned_char,_8,_false>_> *in_stack_fffffffffffffe10;
  int local_1dc;
  AssertHelper *in_stack_fffffffffffffe50;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe64;
  int iVar6;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  ACMRandom *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  
  memcpy(&stack0xfffffffffffffe68,&DAT_018bbac0,0x180);
  uVar3 = 0x80;
  uVar4 = 0x80;
  anon_unknown.dwarf_4f15e6::noise_synth
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             (int (*) [2])CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (double *)in_stack_fffffffffffffe58._M_head_impl,(double *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  for (iVar6 = 0; iVar6 < 0x4000; iVar6 = iVar6 + 1) {
    *(char *)(*(long *)(in_RDI + 0x348) + (long)iVar6) =
         (char)(int)(*(double *)(*(long *)(in_RDI + 0x378) + (long)iVar6 * 8) + 128.0);
  }
  lhs_expression = in_RDI + 0x330;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x330));
  uVar5 = CONCAT13(1,(int3)in_stack_fffffffffffffe60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,uVar4),CONCAT44(in_stack_fffffffffffffdcc,uVar3),
             (value_type_conflict2 *)0x5ee75a);
  uVar3 = 0;
  iVar2 = NoiseModelUpdateTest<BitDepthParams<unsigned_char,_8,_false>_>::NoiseModelUpdate
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (lhs_expression,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (int *)CONCAT44(in_stack_fffffffffffffdd4,uVar4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffde0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5ee7d7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_RDI,
               (int)((ulong)lhs_expression >> 0x20),in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe50,(Message *)CONCAT44(uVar3,iVar2));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdd4,uVar4));
    testing::Message::~Message((Message *)0x5ee825);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee87e);
  uVar4 = 0x80;
  anon_unknown.dwarf_4f15e6::noise_synth
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             (int (*) [2])CONCAT44(iVar6,uVar5),(double *)in_stack_fffffffffffffe58._M_head_impl,
             (double *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88
            );
  for (local_1dc = 0; local_1dc < 0x4000; local_1dc = local_1dc + 1) {
    *(char *)(*(long *)(in_RDI + 0x348) + (long)local_1dc) =
         (char)(int)(*(double *)(*(long *)(in_RDI + 0x378) + (long)local_1dc * 8) + 128.0);
  }
  NoiseModelUpdateTest<BitDepthParams<unsigned_char,_8,_false>_>::NoiseModelUpdate
            (in_stack_fffffffffffffe10,3);
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (lhs_expression,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (int *)CONCAT44(in_stack_fffffffffffffdd4,uVar4));
  iVar6 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee9c4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_RDI,iVar6,
               in_stack_fffffffffffffde0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe50,(Message *)CONCAT44(uVar3,iVar2));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffdd4,uVar4));
    testing::Message::~Message((Message *)0x5eea12);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eea62);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, NoiseCoeffsSignalsDifferentNoiseType) {
  aom_noise_model_t &model = this->model_;
  const int width = this->kWidth;
  const int height = this->kHeight;
  const double kCoeffs[2][24] = {
    { 0.02884, -0.03356, 0.00633,  0.01757,  0.02849,  -0.04620,
      0.02833, -0.07178, 0.07076,  -0.11603, -0.10413, -0.16571,
      0.05158, -0.07969, 0.02640,  -0.07191, 0.02530,  0.41968,
      0.21450, -0.00702, -0.01401, -0.03676, -0.08713, 0.44196 },
    { 0.00269, -0.01291, -0.01513, 0.07234,  0.03208,   0.00477,
      0.00226, -0.00254, 0.03533,  0.12841,  -0.25970,  -0.06336,
      0.05238, -0.00845, -0.03118, 0.09043,  -0.36558,  0.48903,
      0.00595, -0.11938, 0.02106,  0.095956, -0.350139, 0.59305 }
  };

  noise_synth(&this->random_, model.params.lag, model.n, model.coords,
              kCoeffs[0], this->noise_ptr_[0], width, height);
  for (int i = 0; i < width * height; ++i) {
    this->data_ptr_[0][i] = (uint8_t)(128 + this->noise_ptr_[0][i]);
  }
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  EXPECT_EQ(AOM_NOISE_STATUS_OK, this->NoiseModelUpdate());

  // Now try with the second set of AR coefficients
  noise_synth(&this->random_, model.params.lag, model.n, model.coords,
              kCoeffs[1], this->noise_ptr_[0], width, height);
  for (int i = 0; i < width * height; ++i) {
    this->data_ptr_[0][i] = (uint8_t)(128 + this->noise_ptr_[0][i]);
  }
  EXPECT_EQ(AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE, this->NoiseModelUpdate());
}